

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plane.cpp
# Opt level: O1

Color * __thiscall Plane::getColor(Color *__return_storage_ptr__,Plane *this,Vector3 *P)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined4 extraout_EAX;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dStack_90;
  Vector3 local_48;
  
  if ((this->super_Primitive).texture.data == (Vec3b *)0x0) {
    __return_storage_ptr__->z = (this->super_Primitive).color.z;
    dVar1 = (this->super_Primitive).color.y;
    __return_storage_ptr__->x = (this->super_Primitive).color.x;
    __return_storage_ptr__->y = dVar1;
  }
  else {
    operator-(P,&this->O);
    dVar1 = Vector3::dot(&local_48,&this->Dx);
    dVar2 = Vector3::len2(&this->Dx);
    operator-(P,&this->O);
    dVar3 = Vector3::dot(&local_48,&this->Dy);
    dVar4 = Vector3::len2(&this->Dy);
    auVar6._0_8_ = ABS(dVar1);
    auVar6._8_8_ = ABS(dVar3);
    auVar7._8_4_ = SUB84(dVar4,0);
    auVar7._0_8_ = dVar2;
    auVar7._12_4_ = (int)((ulong)dVar4 >> 0x20);
    auVar7 = divpd(auVar6,auVar7);
    dVar1 = floor(auVar7._0_8_);
    dStack_90 = auVar7._8_8_;
    dVar2 = floor(dStack_90);
    dVar1 = auVar7._0_8_ - dVar1;
    dStack_90 = dStack_90 - dVar2;
    auVar8._8_8_ = -(ulong)(-1e-05 <= dStack_90);
    auVar8._0_8_ = -(ulong)(-1e-05 <= dVar1);
    iVar5 = movmskpd(extraout_EAX,auVar8);
    if (((iVar5 != 3) || ((-1e-05 <= dVar1 + -1.0 && (1e-05 < dVar1 + -1.0)))) ||
       ((-1e-05 <= dStack_90 + -1.0 && (1e-05 < dStack_90 + -1.0)))) {
      __assert_fail("sign(x) >= 0 && sign(y) >=0 && sign(x - 1) <= 0 && sign(y - 1) <= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lazycal[P]Progressive-Photon-Mapping/Plane.cpp"
                    ,0x3b,"virtual Color Plane::getColor(const Vector3 &)");
    }
    Picture::getColor(__return_storage_ptr__,&(this->super_Primitive).texture,dVar1,dStack_90);
  }
  return __return_storage_ptr__;
}

Assistant:

Color Plane::getColor(const Vector3 &P)
{
    if (texture.data == NULL) return color;
    double x = std::abs((P - O).dot(Dx)) / Dx.len2(), y = std::abs((P - O).dot(Dy)) / Dy.len2();
    x -= floor(x); y -= floor(y);
#ifdef DEBUG
    assert(sign(x) >= 0 && sign(y) >=0 && sign(x - 1) <= 0 && sign(y - 1) <= 0);
#endif
    return texture.getColor(x, y);
}